

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall
xmrig::Client::parseNotification(Client *this,char *method,Value *params,Value *error)

{
  IClientListener *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Type pGVar5;
  Ch *pCVar6;
  char *pcVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  Client *in_RDI;
  int code;
  int *in_stack_00000238;
  Value *in_stack_00000240;
  Client *in_stack_00000248;
  char *in_stack_ffffffffffffffb8;
  
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(in_RCX);
  if (bVar2) {
    bVar2 = BaseClient::isQuiet(&in_RDI->super_BaseClient);
    if (!bVar2) {
      this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)url((Client *)0x1c179a);
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,in_stack_ffffffffffffffb8);
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,in_stack_ffffffffffffffb8);
      uVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pGVar5);
      Log::print(ERR,"[%s] error: \"%s\", code: %d",this_00,pCVar6,(ulong)uVar3);
    }
  }
  else if (in_RSI != (char *)0x0) {
    iVar4 = strcmp(in_RSI,"job");
    if (iVar4 == 0) {
      iVar4 = (int)in_RDX;
      bVar2 = parseJob(in_stack_00000248,in_stack_00000240,in_stack_00000238);
      if (bVar2) {
        pIVar1 = (in_RDI->super_BaseClient).m_listener;
        (*pIVar1->_vptr_IClientListener[3])(pIVar1,in_RDI,&(in_RDI->super_BaseClient).m_job,in_RDX);
      }
      else {
        close(in_RDI,iVar4);
      }
    }
    else {
      pcVar7 = url((Client *)0x1c1873);
      Log::print(WARNING,"[%s] unsupported method: \"%s\"",pcVar7,in_RSI);
    }
  }
  return;
}

Assistant:

void xmrig::Client::parseNotification(const char *method, const rapidjson::Value &params, const rapidjson::Value &error)
{
    if (error.IsObject()) {
        if (!isQuiet()) {
            LOG_ERR("[%s] error: \"%s\", code: %d", url(), error["message"].GetString(), error["code"].GetInt());
        }
        return;
    }

    if (!method) {
        return;
    }

    if (strcmp(method, "job") == 0) {
        int code = -1;
        if (parseJob(params, &code)) {
            m_listener->onJobReceived(this, m_job, params);
        }
        else {
            close();
        }

        return;
    }

    LOG_WARN("[%s] unsupported method: \"%s\"", url(), method);
}